

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractMuxer.h
# Opt level: O1

string * __thiscall
AbstractMuxer::getNextName(string *__return_storage_ptr__,AbstractMuxer *this,string *curName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (curName->_M_dataplus)._M_p;
  paVar1 = &curName->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&curName->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = curName->_M_string_length;
  (curName->_M_dataplus)._M_p = (pointer)paVar1;
  curName->_M_string_length = 0;
  (curName->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

virtual std::string getNextName(std::string curName) { return curName; }